

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RawSchema * __thiscall kj::Arena::allocate<capnp::_::RawSchema>(Arena *this)

{
  RawSchema *pRVar1;
  
  pRVar1 = (RawSchema *)allocateBytes(this,0x78,8,false);
  pRVar1->id = 0;
  pRVar1->encodedNode = (word *)0x0;
  *(undefined8 *)&pRVar1->encodedSize = 0;
  pRVar1->dependencies = (RawSchema **)0x0;
  pRVar1->membersByName = (uint16_t *)0x0;
  pRVar1->dependencyCount = 0;
  pRVar1->memberCount = 0;
  pRVar1->membersByDiscriminant = (uint16_t *)0x0;
  pRVar1->canCastTo = (RawSchema *)0x0;
  pRVar1->lazyInitializer = (Initializer *)0x0;
  (pRVar1->defaultBrand).generic = (RawSchema *)0x0;
  *(undefined8 *)&pRVar1->mayContainCapabilities = 0;
  (pRVar1->defaultBrand).scopes = (Scope *)0x0;
  (pRVar1->defaultBrand).dependencies = (Dependency *)0x0;
  (pRVar1->defaultBrand).scopeCount = 0;
  (pRVar1->defaultBrand).dependencyCount = 0;
  (pRVar1->defaultBrand).lazyInitializer = (Initializer *)0x0;
  pRVar1->mayContainCapabilities = true;
  return pRVar1;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}